

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool cmPolicies::ApplyPolicyVersion(cmMakefile *mf,string *version_min,string *version_max)

{
  string *psVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  ostream *poVar7;
  ulong uVar8;
  string local_6f0;
  ostringstream local_6d0 [8];
  ostringstream e_3;
  string local_558;
  ostringstream local_538 [8];
  ostringstream e_2;
  uint local_3bc;
  uint local_3b8;
  uint maxTweak;
  uint maxPatch;
  uint maxMinor;
  uint maxMajor;
  uint polPatch;
  uint polMinor;
  uint polMajor;
  ostringstream local_380 [8];
  ostringstream e_1;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream e;
  uint local_38;
  uint local_34;
  uint minTweak;
  uint minPatch;
  uint minMinor;
  uint minMajor;
  string *version_max_local;
  string *version_min_local;
  cmMakefile *mf_local;
  
  minPatch = 2;
  minTweak = 0;
  local_34 = 0;
  local_38 = 0;
  _minMinor = version_max;
  version_max_local = version_min;
  version_min_local = (string *)mf;
  uVar6 = std::__cxx11::string::c_str();
  iVar2 = __isoc99_sscanf(uVar6,"%u.%u.%u.%u",&minPatch,&minTweak,&local_34,&local_38);
  psVar1 = version_min_local;
  uVar5 = minPatch;
  if (iVar2 < 2) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar7 = std::operator<<((ostream *)local_1b0,"Invalid policy version value \"");
    poVar7 = std::operator<<(poVar7,(string *)version_max_local);
    poVar7 = std::operator<<(poVar7,"\".  ");
    std::operator<<(poVar7,"A numeric major.minor[.patch[.tweak]] must be given.");
    psVar1 = version_min_local;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage((cmMakefile *)psVar1,FATAL_ERROR,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    mf_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    goto LAB_0026809f;
  }
  if ((minPatch < 2) || ((minPatch == 2 && (minTweak < 4)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.  For compatibility with older versions please use any CMake 2.8.x release or lower."
               ,&local_201);
    cmMakefile::IssueMessage((cmMakefile *)psVar1,FATAL_ERROR,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    mf_local._7_1_ = 0;
    goto LAB_0026809f;
  }
  uVar3 = cmVersion::GetMajorVersion();
  uVar4 = minPatch;
  if (uVar3 < uVar5) {
LAB_00267b9b:
    std::__cxx11::ostringstream::ostringstream(local_380);
    poVar7 = std::operator<<((ostream *)local_380,
                             "An attempt was made to set the policy version of CMake to \"");
    poVar7 = std::operator<<(poVar7,(string *)version_max_local);
    poVar7 = std::operator<<(poVar7,"\" which is greater than this version of CMake.  ");
    poVar7 = std::operator<<(poVar7,"This is not allowed because the greater version may have new ")
    ;
    poVar7 = std::operator<<(poVar7,"policies not known to this CMake.  ");
    std::operator<<(poVar7,"You may need a newer CMake version to build this project.");
    psVar1 = version_min_local;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage((cmMakefile *)psVar1,FATAL_ERROR,(string *)&polMinor);
    std::__cxx11::string::~string((string *)&polMinor);
    mf_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_380);
    goto LAB_0026809f;
  }
  uVar3 = cmVersion::GetMajorVersion();
  uVar5 = minTweak;
  if (uVar4 == uVar3) {
    uVar4 = cmVersion::GetMinorVersion();
    if (uVar4 < uVar5) goto LAB_00267b9b;
  }
  uVar4 = minPatch;
  uVar3 = cmVersion::GetMajorVersion();
  uVar5 = minTweak;
  if (uVar4 == uVar3) {
    uVar3 = cmVersion::GetMinorVersion();
    uVar4 = local_34;
    if (uVar5 == uVar3) {
      uVar5 = cmVersion::GetPatchVersion();
      if (uVar5 < uVar4) goto LAB_00267b9b;
    }
  }
  uVar4 = minPatch;
  uVar3 = cmVersion::GetMajorVersion();
  uVar5 = minTweak;
  if (uVar4 == uVar3) {
    uVar3 = cmVersion::GetMinorVersion();
    uVar4 = local_34;
    if (uVar5 == uVar3) {
      uVar3 = cmVersion::GetPatchVersion();
      uVar5 = local_38;
      if (uVar4 == uVar3) {
        uVar4 = cmVersion::GetTweakVersion();
        if (uVar4 < uVar5) goto LAB_00267b9b;
      }
    }
  }
  polPatch = minPatch;
  maxMajor = minTweak;
  maxMinor = local_34;
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    maxPatch = 0;
    maxTweak = 0;
    local_3b8 = 0;
    local_3bc = 0;
    uVar6 = std::__cxx11::string::c_str();
    iVar2 = __isoc99_sscanf(uVar6,"%u.%u.%u.%u",&maxPatch,&maxTweak,&local_3b8,&local_3bc);
    if (iVar2 < 2) {
      std::__cxx11::ostringstream::ostringstream(local_538);
      poVar7 = std::operator<<((ostream *)local_538,"Invalid policy max version value \"");
      poVar7 = std::operator<<(poVar7,(string *)_minMinor);
      poVar7 = std::operator<<(poVar7,"\".  ");
      std::operator<<(poVar7,"A numeric major.minor[.patch[.tweak]] must be given.");
      psVar1 = version_min_local;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage((cmMakefile *)psVar1,FATAL_ERROR,&local_558);
      std::__cxx11::string::~string((string *)&local_558);
      mf_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_538);
      goto LAB_0026809f;
    }
    if ((((maxPatch < minPatch) || ((minPatch == maxPatch && (maxTweak < minTweak)))) ||
        ((minPatch == maxPatch && ((minTweak == maxTweak && (local_3b8 < local_34)))))) ||
       ((minPatch == maxPatch &&
        (((minTweak == maxTweak && (local_34 == local_3b8)) && (local_3bc < local_38)))))) {
      std::__cxx11::ostringstream::ostringstream(local_6d0);
      poVar7 = std::operator<<((ostream *)local_6d0,"Policy VERSION range \"");
      poVar7 = std::operator<<(poVar7,(string *)version_max_local);
      poVar7 = std::operator<<(poVar7,"...");
      poVar7 = std::operator<<(poVar7,(string *)_minMinor);
      poVar7 = std::operator<<(poVar7,"\"");
      std::operator<<(poVar7," specifies a larger minimum than maximum.");
      psVar1 = version_min_local;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage((cmMakefile *)psVar1,FATAL_ERROR,&local_6f0);
      std::__cxx11::string::~string((string *)&local_6f0);
      mf_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_6d0);
      goto LAB_0026809f;
    }
    polPatch = maxPatch;
    maxMajor = maxTweak;
    maxMinor = local_3b8;
  }
  mf_local._7_1_ = ApplyPolicyVersion((cmMakefile *)version_min_local,polPatch,maxMajor,maxMinor);
LAB_0026809f:
  return (bool)(mf_local._7_1_ & 1);
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf,
                                    std::string const& version_min,
                                    std::string const& version_max)
{
  // Parse components of the minimum version.
  unsigned int minMajor = 2;
  unsigned int minMinor = 0;
  unsigned int minPatch = 0;
  unsigned int minTweak = 0;
  if (sscanf(version_min.c_str(), "%u.%u.%u.%u", &minMajor, &minMinor,
             &minPatch, &minTweak) < 2) {
    std::ostringstream e;
    e << "Invalid policy version value \"" << version_min << "\".  "
      << "A numeric major.minor[.patch[.tweak]] must be given.";
    mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return false;
  }

  // it is an error if the policy version is less than 2.4
  if (minMajor < 2 || (minMajor == 2 && minMinor < 4)) {
    mf->IssueMessage(
      MessageType::FATAL_ERROR,
      "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.  "
      "For compatibility with older versions please use any CMake 2.8.x "
      "release or lower.");
    return false;
  }

  // It is an error if the policy version is greater than the running
  // CMake.
  if (minMajor > cmVersion::GetMajorVersion() ||
      (minMajor == cmVersion::GetMajorVersion() &&
       minMinor > cmVersion::GetMinorVersion()) ||
      (minMajor == cmVersion::GetMajorVersion() &&
       minMinor == cmVersion::GetMinorVersion() &&
       minPatch > cmVersion::GetPatchVersion()) ||
      (minMajor == cmVersion::GetMajorVersion() &&
       minMinor == cmVersion::GetMinorVersion() &&
       minPatch == cmVersion::GetPatchVersion() &&
       minTweak > cmVersion::GetTweakVersion())) {
    std::ostringstream e;
    e << "An attempt was made to set the policy version of CMake to \""
      << version_min << "\" which is greater than this version of CMake.  "
      << "This is not allowed because the greater version may have new "
      << "policies not known to this CMake.  "
      << "You may need a newer CMake version to build this project.";
    mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return false;
  }

  unsigned int polMajor = minMajor;
  unsigned int polMinor = minMinor;
  unsigned int polPatch = minPatch;

  if (!version_max.empty()) {
    // Parse components of the maximum version.
    unsigned int maxMajor = 0;
    unsigned int maxMinor = 0;
    unsigned int maxPatch = 0;
    unsigned int maxTweak = 0;
    if (sscanf(version_max.c_str(), "%u.%u.%u.%u", &maxMajor, &maxMinor,
               &maxPatch, &maxTweak) < 2) {
      std::ostringstream e;
      e << "Invalid policy max version value \"" << version_max << "\".  "
        << "A numeric major.minor[.patch[.tweak]] must be given.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }

    // It is an error if the min version is greater than the max version.
    if (minMajor > maxMajor || (minMajor == maxMajor && minMinor > maxMinor) ||
        (minMajor == maxMajor && minMinor == maxMinor &&
         minPatch > maxPatch) ||
        (minMajor == maxMajor && minMinor == maxMinor &&
         minPatch == maxPatch && minTweak > maxTweak)) {
      std::ostringstream e;
      e << "Policy VERSION range \"" << version_min << "..." << version_max
        << "\""
        << " specifies a larger minimum than maximum.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }

    // Use the max version as the policy version.
    polMajor = maxMajor;
    polMinor = maxMinor;
    polPatch = maxPatch;
  }

  return cmPolicies::ApplyPolicyVersion(mf, polMajor, polMinor, polPatch);
}